

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O2

void __thiscall duckdb::UniqueConstraint::Serialize(UniqueConstraint *this,Serializer *serializer)

{
  Constraint::Serialize(&this->super_Constraint,serializer);
  Serializer::WritePropertyWithDefault<bool>(serializer,200,"is_primary_key",&this->is_primary_key);
  Serializer::WriteProperty<duckdb::LogicalIndex>(serializer,0xc9,"index",&this->index);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xca,"columns",&this->columns);
  return;
}

Assistant:

void UniqueConstraint::Serialize(Serializer &serializer) const {
	Constraint::Serialize(serializer);
	serializer.WritePropertyWithDefault<bool>(200, "is_primary_key", is_primary_key);
	serializer.WriteProperty<LogicalIndex>(201, "index", index);
	serializer.WritePropertyWithDefault<vector<string>>(202, "columns", columns);
}